

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_logging_cfg.c
# Opt level: O0

void oonf_logcfg_schema_help(cfg_schema_entry *entry,autobuf *out)

{
  size_t sVar1;
  char *pcVar2;
  ulong local_20;
  size_t i;
  autobuf *out_local;
  cfg_schema_entry *entry_local;
  
  cfg_append_printable_line(out,"    Parameter must be on of the following list:");
  abuf_puts(out,"    ");
  local_20 = 0;
  while( true ) {
    sVar1 = oonf_log_get_sourcecount();
    if (sVar1 <= local_20) break;
    pcVar2 = ", ";
    if (local_20 == 0) {
      pcVar2 = "";
    }
    abuf_appendf(out,"%s\'%s\'",pcVar2,LOG_SOURCE_NAMES[local_20]);
    local_20 = local_20 + 1;
  }
  abuf_puts(out,"\n");
  return;
}

Assistant:

void
oonf_logcfg_schema_help(const struct cfg_schema_entry *entry __attribute__((unused)), struct autobuf *out) {
  size_t i;

  cfg_append_printable_line(out, "    Parameter must be on of the following list:");

  abuf_puts(out, "    ");
  for (i = 0; i < oonf_log_get_sourcecount(); i++) {
    abuf_appendf(out, "%s'%s'", i == 0 ? "" : ", ", LOG_SOURCE_NAMES[i]);
  }
  abuf_puts(out, "\n");
}